

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddApa.c
# Opt level: O0

DdApaNumber
cuddApaCountMintermAux(DdNode *node,int digits,DdApaNumber max,DdApaNumber min,st__table *table)

{
  int iVar1;
  DdApaNumber a;
  DdApaNumber b;
  DdApaDigit local_64;
  DdApaDigit carryout;
  DdApaNumber mint2;
  DdApaNumber mint1;
  DdApaNumber mint;
  DdNode *Ne;
  DdNode *Nt;
  st__table *table_local;
  DdApaNumber min_local;
  DdApaNumber max_local;
  DdNode *pDStack_18;
  int digits_local;
  DdNode *node_local;
  
  if (node->index == 0x7fffffff) {
    node_local = (DdNode *)min;
    if ((node != background) && (node != zero)) {
      node_local = (DdNode *)max;
    }
  }
  else {
    Nt = (DdNode *)table;
    table_local = (st__table *)min;
    min_local = max;
    max_local._4_4_ = digits;
    pDStack_18 = node;
    if ((node->ref < 2) || (iVar1 = st__lookup(table,(char *)node,(char **)&mint1), iVar1 == 0)) {
      Ne = (pDStack_18->type).kids.T;
      mint = &((pDStack_18->type).kids.E)->index;
      a = cuddApaCountMintermAux
                    (Ne,max_local._4_4_,min_local,(DdApaNumber)table_local,(st__table *)Nt);
      if (a == (DdApaNumber)0x0) {
        node_local = (DdNode *)0x0;
      }
      else {
        b = cuddApaCountMintermAux
                      ((DdNode *)((ulong)mint & 0xfffffffffffffffe),max_local._4_4_,min_local,
                       (DdApaNumber)table_local,(st__table *)Nt);
        if (b == (DdApaNumber)0x0) {
          if ((Ne->ref == 1) && (a != (DdApaNumber)0x0)) {
            free(a);
          }
          node_local = (DdNode *)0x0;
        }
        else {
          mint1 = Cudd_NewApaNumber(max_local._4_4_);
          if (mint1 == (DdApaNumber)0x0) {
            if ((Ne->ref == 1) && (a != (DdApaNumber)0x0)) {
              free(a);
            }
            if ((*(int *)(((ulong)mint & 0xfffffffffffffffe) + 4) == 1) && (b != (DdApaNumber)0x0))
            {
              free(b);
            }
            node_local = (DdNode *)0x0;
          }
          else {
            if (((ulong)mint & 1) == 0) {
              local_64 = Cudd_ApaAdd(max_local._4_4_,a,b,mint1);
            }
            else {
              Cudd_ApaSubtract(max_local._4_4_,min_local,b,mint1);
              local_64 = Cudd_ApaAdd(max_local._4_4_,a,mint1,mint1);
            }
            Cudd_ApaShiftRight(max_local._4_4_,local_64,mint1,mint1);
            if ((Ne->ref == 1) && (a != (DdApaNumber)0x0)) {
              free(a);
            }
            if ((*(int *)(((ulong)mint & 0xfffffffffffffffe) + 4) == 1) && (b != (DdApaNumber)0x0))
            {
              free(b);
            }
            if ((pDStack_18->ref < 2) ||
               (iVar1 = st__insert((st__table *)Nt,(char *)pDStack_18,(char *)mint1),
               iVar1 != -10000)) {
              node_local = (DdNode *)mint1;
            }
            else {
              if (mint1 != (DdApaNumber)0x0) {
                free(mint1);
              }
              node_local = (DdNode *)0x0;
            }
          }
        }
      }
    }
    else {
      node_local = (DdNode *)mint1;
    }
  }
  return &node_local->index;
}

Assistant:

static DdApaNumber
cuddApaCountMintermAux(
  DdNode * node,
  int  digits,
  DdApaNumber  max,
  DdApaNumber  min,
  st__table * table)
{
    DdNode      *Nt, *Ne;
    DdApaNumber mint, mint1, mint2;
    DdApaDigit  carryout;

    if (cuddIsConstant(node)) {
        if (node == background || node == zero) {
            return(min);
        } else {
            return(max);
        }
    }
    if (node->ref > 1 && st__lookup(table, (const char *)node, (char **)&mint)) {
        return(mint);
    }

    Nt = cuddT(node); Ne = cuddE(node);

    mint1 = cuddApaCountMintermAux(Nt,  digits, max, min, table);
    if (mint1 == NULL) return(NULL);
    mint2 = cuddApaCountMintermAux(Cudd_Regular(Ne), digits, max, min, table);
    if (mint2 == NULL) {
        if (Nt->ref == 1) ABC_FREE(mint1);
        return(NULL);
    }
    mint = Cudd_NewApaNumber(digits);
    if (mint == NULL) {
        if (Nt->ref == 1) ABC_FREE(mint1);
        if (Cudd_Regular(Ne)->ref == 1) ABC_FREE(mint2);
        return(NULL);
    }
    if (Cudd_IsComplement(Ne)) {
        (void) Cudd_ApaSubtract(digits,max,mint2,mint);
        carryout = Cudd_ApaAdd(digits,mint1,mint,mint);
    } else {
        carryout = Cudd_ApaAdd(digits,mint1,mint2,mint);
    }
    Cudd_ApaShiftRight(digits,carryout,mint,mint);
    /* If the refernce count of a child is 1, its minterm count
    ** hasn't been stored in table.  Therefore, it must be explicitly
    ** freed here. */
    if (Nt->ref == 1) ABC_FREE(mint1);
    if (Cudd_Regular(Ne)->ref == 1) ABC_FREE(mint2);

    if (node->ref > 1) {
        if ( st__insert(table, (char *)node, (char *)mint) == st__OUT_OF_MEM) {
            ABC_FREE(mint);
            return(NULL);
        }
    }
    return(mint);

}